

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::iterate(TextureCubeShadowCase *this)

{
  size_type *psVar1;
  pointer pfVar2;
  ulong uVar3;
  TestLog *log;
  RenderContext *context;
  pointer pFVar4;
  int y;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  CompareMode CVar8;
  undefined4 extraout_var;
  RenderTarget *pRVar10;
  undefined8 *puVar11;
  pointer pFVar12;
  NotSupportedError *this_00;
  char *description;
  int *piVar13;
  qpTestResult testResult;
  ulong uVar14;
  TestContext *pTVar15;
  uint uVar16;
  void *pvVar17;
  CubeFace face;
  Surface result;
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport viewport;
  TexComparePrecision local_2e8;
  TextureFormat local_2c0;
  LodPrecision local_2b8;
  undefined4 uStack_2ac;
  ulong local_2a8 [2];
  PixelFormat pixelFormat;
  ulong local_288 [3];
  long local_270;
  ScopedLogSection iterSection;
  undefined1 local_248 [76];
  _func_int **pp_Stack_1fc;
  undefined8 local_1f4;
  undefined4 uStack_1ec;
  CompareMode CStack_1e8;
  int local_1e4;
  anon_union_16_3_1194ccdc_for_v local_1e0;
  bool local_1d0;
  undefined7 uStack_1cf;
  LodMode local_1c8;
  undefined1 local_1b0 [8];
  _func_int **pp_Stack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  int local_190;
  anon_union_16_3_1194ccdc_for_v local_18c [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar16 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar16 = (uVar16 >> 4 ^ uVar16) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,pRVar10,0x1c,0x1c,uVar16 >> 0xf ^ dVar7 ^ uVar16);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  piVar13 = local_2e8.uvwBits.m_data + 1;
  local_2e8.coordBits.m_data._0_8_ = piVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = (long)result.m_pixels.m_ptr +
          CONCAT44(local_2e8.uvwBits.m_data[0],local_2e8.coordBits.m_data[2]);
  uVar14 = 0xf;
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar13) {
    uVar14 = CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]);
  }
  if (uVar14 < uVar3) {
    uVar14 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar14 = result.m_pixels.m_cap;
    }
    if (uVar14 < uVar3) goto LAB_01136635;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&result,0,(char *)0x0,local_2e8.coordBits.m_data._0_8_);
  }
  else {
LAB_01136635:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_2e8,(ulong)CONCAT44(result.m_height,result.m_width));
  }
  local_248._0_8_ = local_248 + 0x10;
  psVar1 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar1) {
    local_248._16_8_ = *psVar1;
    local_248._24_4_ = *(undefined4 *)(puVar11 + 3);
    local_248._28_4_ = *(undefined4 *)((long)puVar11 + 0x1c);
  }
  else {
    local_248._16_8_ = *psVar1;
    local_248._0_8_ = (size_type *)*puVar11;
  }
  local_248._8_8_ = puVar11[1];
  *puVar11 = psVar1;
  puVar11[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar3 = CONCAT44(uStack_2ac,local_2b8.lodBits) + pixelFormat._8_8_;
  uVar14 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_288) {
    uVar14 = local_288[0];
  }
  if (uVar14 < uVar3) {
    uVar14 = 0xf;
    if ((ulong *)local_2b8._0_8_ != local_2a8) {
      uVar14 = local_2a8[0];
    }
    if (uVar3 <= uVar14) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_0113679a;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&pixelFormat,local_2b8._0_8_);
LAB_0113679a:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar11 + 2);
  if ((pointer)*puVar11 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar11;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar11[1];
  *puVar11 = pfVar2;
  puVar11[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&iterSection,log,(string *)local_248,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)local_2b8._0_8_ != local_2a8) {
    operator_delete((void *)local_2b8._0_8_,local_2a8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_288) {
    operator_delete((void *)pixelFormat._0_8_,local_288[0] + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((int *)local_2e8.coordBits.m_data._0_8_ != piVar13) {
    operator_delete((void *)local_2e8.coordBits.m_data._0_8_,
                    CONCAT44(local_2e8.uvwBits.m_data[2],local_2e8.uvwBits.m_data[1]) + 1);
  }
  pFVar12 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_248,TEXTURETYPE_CUBE);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Too small render target",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
               ,0x25f);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0xb8))(0x8513,pFVar12->texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2800,this->m_magFilter);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2802,this->m_wrapS);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x2803,this->m_wrapT);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x884c,0x884e);
  (**(code **)(lVar9 + 0x1360))(0x8513,0x884d,this->m_compareFunc);
  (**(code **)(lVar9 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  glu::mapGLSampler((Sampler *)local_1b0,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  local_1e4 = local_190;
  local_1f4 = local_1a0;
  _uStack_1ec = uStack_198;
  local_248._68_8_ = local_1b0;
  pp_Stack_1fc = pp_Stack_1a8;
  local_1e0._0_8_ = local_18c[0]._0_8_;
  local_1e0._8_8_ = local_18c[0]._8_8_;
  uStack_1cf = (undefined7)((ulong)local_18c[1]._0_8_ >> 8);
  local_1d0 = true;
  CVar8 = glu::mapGLCompareFunc(this->m_compareFunc);
  CStack_1e8 = CVar8;
  local_248._4_4_ = 3;
  local_1c8 = LODMODE_EXACT;
  local_248._32_4_ = pFVar12->ref;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
  local_270 = lVar9;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1a8,"Compare reference value =  ",0x1b);
  std::ostream::_M_insert<double>((double)(float)local_248._32_4_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)&pp_Stack_1a8,&pFVar12->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8," -> ",4);
  tcu::operator<<((ostream *)&pp_Stack_1a8,&pFVar12->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
  std::ios_base::~ios_base(local_138);
  face = CUBEFACE_NEGATIVE_X;
  piVar13 = &DAT_01bf0d34;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar12->bottomLeft,&pFVar12->topRight);
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1a8,"Face ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1a8,(char *)((long)&DAT_01bf0d34 + (long)*piVar13),2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
    std::ios_base::~ios_base(local_138);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_248);
    dVar7 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar7,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x288);
    y = viewport.y;
    iVar6 = viewport.x;
    context = ((this->super_TestCase).m_context)->m_renderCtx;
    local_2e8.coordBits.m_data[0] = 8;
    local_2e8.coordBits.m_data[1] = 3;
    pvVar17 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar17 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,result.m_width,
               result.m_height,1,pvVar17);
    glu::readPixels(context,iVar6,y,(PixelBufferAccess *)local_1b0);
    dVar7 = (**(code **)(local_270 + 0x800))();
    glu::checkError(dVar7,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureShadowTests.cpp"
                    ,0x28b);
    pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
    pixelFormat.redBits = (pRVar10->m_pixelFormat).redBits;
    pixelFormat.greenBits = (pRVar10->m_pixelFormat).greenBits;
    pixelFormat.blueBits = (pRVar10->m_pixelFormat).blueBits;
    pixelFormat.alphaBits = (pRVar10->m_pixelFormat).alphaBits;
    local_2b8._0_8_ = (ulong *)0xa00000000;
    local_2b8.lodBits = 5;
    local_2e8.coordBits.m_data._0_8_ = (int *)0xa0000000a;
    local_2e8.coordBits.m_data[2] = 10;
    local_2e8.uvwBits.m_data[0] = 6;
    local_2e8.uvwBits.m_data[1] = 6;
    local_2e8.uvwBits.m_data[2] = 0;
    local_2e8.pcfBits = 5;
    local_2e8.referenceBits = 0x10;
    local_2e8.resultBits = pixelFormat.redBits + -1;
    pTVar15 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_2c0.order = RGBA;
    local_2c0.type = UNORM_INT8;
    pvVar17 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar17 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1b0,&local_2c0,result.m_width,result.m_height,1,pvVar17);
    bVar5 = verifyTexCompareResult<tcu::TextureCube>
                      (pTVar15,(ConstPixelBufferAccess *)local_1b0,&pFVar12->texture->m_refTexture,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_248,&local_2e8,
                       &local_2b8,&pixelFormat);
    if (!bVar5) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1a8,
                 "Warning: Verification assuming high-quality PCF filtering failed.",0x41);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
      std::ios_base::~ios_base(local_138);
      local_2b8.lodBits = 4;
      local_2e8.uvwBits.m_data[0] = 4;
      local_2e8.uvwBits.m_data[1] = 4;
      local_2e8.uvwBits.m_data[2] = 0;
      local_2e8.pcfBits = 0;
      pTVar15 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      local_2c0.order = RGBA;
      local_2c0.type = UNORM_INT8;
      pvVar17 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar17 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,&local_2c0,result.m_width,result.m_height,1,pvVar17)
      ;
      bVar5 = verifyTexCompareResult<tcu::TextureCube>
                        (pTVar15,(ConstPixelBufferAccess *)local_1b0,&pFVar12->texture->m_refTexture
                         ,texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_248,&local_2e8,
                         &local_2b8,&pixelFormat);
      if (bVar5) {
        pTVar15 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (pTVar15->m_testResult != QP_TEST_RESULT_PASS) goto LAB_01136f7d;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        description = "Low-quality result";
      }
      else {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pp_Stack_1a8,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar15 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        description = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar15,testResult,description);
    }
LAB_01136f7d:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    piVar13 = piVar13 + 1;
    if (face == CUBEFACE_LAST) {
      iVar6 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar6;
      pFVar12 = (this->m_cases).
                super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar4 = (this->m_cases).
               super__Vector_base<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(iterSection.m_log);
      return (IterateResult)(iVar6 < (int)((ulong)((long)pFVar4 - (long)pFVar12) >> 5));
    }
  } while( true );
}

Assistant:

TextureCubeShadowCase::IterateResult TextureCubeShadowCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const int						viewportSize	= 28;
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::ScopedLogSection		iterSection		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	ReferenceParams					sampleParams	(TEXTURETYPE_CUBE);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Too small render target", DE_NULL, __FILE__, __LINE__);

	// Setup texture
	gl.bindTexture	(GL_TEXTURE_CUBE_MAP, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_MODE,	GL_COMPARE_REF_TO_TEXTURE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_COMPARE_FUNC,	m_compareFunc);

	// Other state
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Params for reference computation.
	sampleParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.sampler.compare			= glu::mapGLCompareFunc(m_compareFunc);
	sampleParams.samplerType				= SAMPLERTYPE_SHADOW;
	sampleParams.lodMode					= LODMODE_EXACT;
	sampleParams.ref						= curCase.ref;

	m_testCtx.getLog()
		<< TestLog::Message
		<< "Compare reference value =  " << sampleParams.ref << "\n"
		<< "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight
		<< TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		m_testCtx.getLog() << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const tcu::PixelFormat		pixelFormat		= m_context.getRenderTarget().getPixelFormat();
			tcu::LodPrecision			lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::TexComparePrecision	texComparePrecision;

			lodPrecision.derivateBits			= 10;
			lodPrecision.lodBits				= 5;
			texComparePrecision.coordBits		= tcu::IVec3(10,10,10);
			texComparePrecision.uvwBits			= tcu::IVec3(6,6,0);
			texComparePrecision.pcfBits			= 5;
			texComparePrecision.referenceBits	= 16;
			texComparePrecision.resultBits		= pixelFormat.redBits-1;

			const bool isHighQuality = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
															  &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				m_testCtx.getLog() << TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << TestLog::EndMessage;

				lodPrecision.lodBits			= 4;
				texComparePrecision.uvwBits		= tcu::IVec3(4,4,0);
				texComparePrecision.pcfBits		= 0;

				const bool isOk = verifyTexCompareResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														 &texCoord[0], sampleParams, texComparePrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}